

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

Type * __thiscall
soul::AST::ArrayElementRef::getResultType(Type *__return_storage_ptr__,ArrayElementRef *this)

{
  bool bVar1;
  Expression *pEVar2;
  ArraySize newSize;
  SliceRange SVar3;
  Type elementType;
  Type arrayOrVectorType;
  Type local_48;
  Type local_30;
  
  pEVar2 = pool_ptr<soul::AST::Expression>::operator->(&this->object);
  (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_30,pEVar2);
  if ((local_30.category & ~primitive) != vector) {
    __return_storage_ptr__->category = invalid;
    __return_storage_ptr__->arrayElementCategory = invalid;
    __return_storage_ptr__->isRef = false;
    __return_storage_ptr__->isConstant = false;
    __return_storage_ptr__->primitiveType = invalid;
    __return_storage_ptr__->boundingSize = 0;
    __return_storage_ptr__->arrayElementBoundingSize = 0;
    (__return_storage_ptr__->structure).object = (Structure *)0x0;
    goto LAB_00208e75;
  }
  Type::getElementType(&local_48,&local_30);
  if (this->isSlice == true) {
    bVar1 = isSliceRangeValid(this);
    if (bVar1) {
      SVar3 = getResolvedSliceRange(this);
      newSize = SVar3.end - SVar3.start;
      if (newSize < 2) goto LAB_00208e23;
      Type::createCopyWithNewArraySize(__return_storage_ptr__,&local_30,newSize);
    }
    else {
      __return_storage_ptr__->category = invalid;
      __return_storage_ptr__->arrayElementCategory = invalid;
      __return_storage_ptr__->isRef = false;
      __return_storage_ptr__->isConstant = false;
      __return_storage_ptr__->primitiveType = invalid;
      __return_storage_ptr__->boundingSize = 0;
      __return_storage_ptr__->arrayElementBoundingSize = 0;
      (__return_storage_ptr__->structure).object = (Structure *)0x0;
    }
  }
  else {
LAB_00208e23:
    __return_storage_ptr__->category = local_48.category;
    __return_storage_ptr__->arrayElementCategory = local_48.arrayElementCategory;
    __return_storage_ptr__->isRef = local_48.isRef;
    __return_storage_ptr__->isConstant = local_48.isConstant;
    __return_storage_ptr__->primitiveType = (PrimitiveType)local_48.primitiveType.type;
    __return_storage_ptr__->boundingSize = local_48.boundingSize;
    __return_storage_ptr__->arrayElementBoundingSize = local_48.arrayElementBoundingSize;
    (__return_storage_ptr__->structure).object = local_48.structure.object;
    local_48.structure.object = (Structure *)0x0;
  }
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_48.structure);
LAB_00208e75:
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_30.structure);
  return __return_storage_ptr__;
}

Assistant:

Type getResultType() const override
        {
            auto arrayOrVectorType = object->getResultType();

            if (! arrayOrVectorType.isArrayOrVector())
                return {};

            auto elementType = arrayOrVectorType.getElementType();

            if (isSlice)
            {
                if (! isSliceRangeValid())
                    return {};

                auto range = getResolvedSliceRange();
                auto sliceSize = (Type::ArraySize) (range.end - range.start);

                if (sliceSize > 1)
                    return arrayOrVectorType.createCopyWithNewArraySize (sliceSize);
            }

            return elementType;
        }